

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.hpp
# Opt level: O0

void __thiscall
boost::unordered::detail::
table<boost::unordered::detail::map<std::allocator<std::pair<const_unsigned_int,_double>_>,_unsigned_int,_double,_boost::hash<unsigned_int>,_std::equal_to<unsigned_int>_>_>
::create_buckets(table<boost::unordered::detail::map<std::allocator<std::pair<const_unsigned_int,_double>_>,_unsigned_int,_double,_boost::hash<unsigned_int>,_std::equal_to<unsigned_int>_>_>
                 *this,size_t new_count)

{
  bucket_allocator *a;
  pointer ppVar1;
  size_t in_RSI;
  table<boost::unordered::detail::map<std::allocator<std::pair<const_unsigned_int,_double>_>,_unsigned_int,_double,_boost::hash<unsigned_int>,_std::equal_to<unsigned_int>_>_>
  *in_RDI;
  array_constructor<std::allocator<boost::unordered::detail::ptr_bucket>_> constructor;
  table<boost::unordered::detail::map<std::allocator<std::pair<const_unsigned_int,_double>_>,_unsigned_int,_double,_boost::hash<unsigned_int>,_std::equal_to<unsigned_int>_>_>
  *in_stack_ffffffffffffffa0;
  ptr_bucket *in_stack_ffffffffffffffb8;
  array_constructor<std::allocator<boost::unordered::detail::ptr_bucket>_>
  *in_stack_ffffffffffffffc0;
  ptr_bucket local_38;
  array_constructor<std::allocator<boost::unordered::detail::ptr_bucket>_> local_30;
  size_t local_10;
  
  local_10 = in_RSI;
  a = bucket_alloc((table<boost::unordered::detail::map<std::allocator<std::pair<const_unsigned_int,_double>_>,_unsigned_int,_double,_boost::hash<unsigned_int>,_std::equal_to<unsigned_int>_>_>
                    *)0x8da1bd);
  array_constructor<std::allocator<boost::unordered::detail::ptr_bucket>_>::array_constructor
            (&local_30,a);
  ptr_bucket::ptr_bucket(&local_38);
  array_constructor<std::allocator<boost::unordered::detail::ptr_bucket>_>::
  construct<boost::unordered::detail::ptr_bucket>
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,(size_t)in_RDI);
  if (in_RDI->buckets_ != (bucket_pointer)0x0) {
    in_stack_ffffffffffffffa0 =
         (table<boost::unordered::detail::map<std::allocator<std::pair<const_unsigned_int,_double>_>,_unsigned_int,_double,_boost::hash<unsigned_int>,_std::equal_to<unsigned_int>_>_>
          *)in_RDI->buckets_[in_RDI->bucket_count_].next_;
    ppVar1 = array_constructor<std::allocator<boost::unordered::detail::ptr_bucket>_>::get
                       (&local_30);
    ppVar1[local_10].next_ = (link_pointer)in_stack_ffffffffffffffa0;
    destroy_buckets(in_RDI);
  }
  in_RDI->bucket_count_ = local_10;
  ppVar1 = array_constructor<std::allocator<boost::unordered::detail::ptr_bucket>_>::release
                     (&local_30);
  in_RDI->buckets_ = ppVar1;
  recalculate_max_load(in_stack_ffffffffffffffa0);
  array_constructor<std::allocator<boost::unordered::detail::ptr_bucket>_>::~array_constructor
            ((array_constructor<std::allocator<boost::unordered::detail::ptr_bucket>_> *)in_RDI);
  return;
}

Assistant:

void create_buckets(std::size_t new_count)
        {
            boost::unordered::detail::array_constructor<bucket_allocator>
                constructor(bucket_alloc());
    
            // Creates an extra bucket to act as the start node.
            constructor.construct(bucket(), new_count + 1);

            if (buckets_)
            {
                // Copy the nodes to the new buckets, including the dummy
                // node if there is one.
                (constructor.get() +
                    static_cast<std::ptrdiff_t>(new_count))->next_ =
                        (buckets_ + static_cast<std::ptrdiff_t>(
                            bucket_count_))->next_;
                destroy_buckets();
            }
            else if (bucket::extra_node)
            {
                node_constructor a(node_alloc());
                a.construct();

                (constructor.get() +
                    static_cast<std::ptrdiff_t>(new_count))->next_ =
                        a.release();
            }

            bucket_count_ = new_count;
            buckets_ = constructor.release();
            recalculate_max_load();
        }